

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteEditionDefaults
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  bool bVar2;
  int file_descriptor;
  Descriptor *extendee;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  ulong uVar7;
  Edition minimum_edition;
  string_view sVar8;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  FileOutputStream out;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  CodedOutputStream coded_out;
  
  sVar8._M_str = "google.protobuf.FeatureSet";
  sVar8._M_len = 0x1a;
  extendee = DescriptorPool::FindMessageTypeByName(pool,sVar8);
  if (extendee == (Descriptor *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&this->edition_defaults_out_name_);
    poVar4 = std::operator<<(poVar4,
                             ": Could not find FeatureSet in descriptor pool.  Please make sure descriptor.proto is in your import path"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar1 = false;
  }
  else {
    extensions.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extensions.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extensions.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DescriptorPool::FindAllExtensions(pool,extendee,&extensions);
    uVar7 = 0x3e6;
    if (this->edition_defaults_minimum_ != EDITION_UNKNOWN) {
      uVar7 = (ulong)this->edition_defaults_minimum_;
    }
    minimum_edition = EDITION_2023;
    if (this->edition_defaults_maximum_ != EDITION_UNKNOWN) {
      minimum_edition = this->edition_defaults_maximum_;
    }
    extensions_00.ptr_ =
         (pointer)((long)extensions.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)extensions.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    extensions_00.len_ = uVar7;
    FeatureResolver::CompileDefaults
              (&defaults,(FeatureResolver *)extendee,
               (Descriptor *)
               extensions.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start,extensions_00,minimum_edition,
               (Edition)extensions.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    psVar6 = &this->edition_defaults_out_name_;
    if (defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_0 ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
      do {
        file_descriptor = open((psVar6->_M_dataplus)._M_p,0x241,0x1b6);
        if (-1 < file_descriptor) {
          io::FileOutputStream::FileOutputStream(&out,file_descriptor,-1);
          io::CodedOutputStream::CodedOutputStream<google::protobuf::io::FileOutputStream,void>
                    (&coded_out,&out);
          coded_out.impl_.is_serialization_deterministic_ = true;
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>
          ::EnsureOk(&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>);
          bVar1 = MessageLite::SerializeToCodedStream
                            ((MessageLite *)
                             &defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.
                              field_1.data_,&coded_out);
          if (bVar1) {
            io::CodedOutputStream::~CodedOutputStream(&coded_out);
            bVar2 = io::FileOutputStream::Close(&out);
            bVar1 = true;
            if (!bVar2) {
              poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
              poVar4 = std::operator<<(poVar4,": ");
              pcVar5 = strerror(out.copying_output_.errno_);
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::endl<char,std::char_traits<char>>(poVar4);
              goto LAB_0019bf10;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
            poVar4 = std::operator<<(poVar4,": ");
            pcVar5 = strerror(out.copying_output_.errno_);
            poVar4 = std::operator<<(poVar4,pcVar5);
            std::endl<char,std::char_traits<char>>(poVar4);
            io::FileOutputStream::Close(&out);
            io::CodedOutputStream::~CodedOutputStream(&coded_out);
LAB_0019bf10:
            bVar1 = false;
          }
          io::FileOutputStream::~FileOutputStream(&out);
          goto LAB_0019bf1c;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      perror((psVar6->_M_dataplus)._M_p);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,": ");
      sVar8 = absl::lts_20250127::Status::message((Status *)&defaults);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,sVar8._M_str,sVar8._M_len);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    bVar1 = false;
LAB_0019bf1c:
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    ~StatusOrData(&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&extensions.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
  }
  return bVar1;
}

Assistant:

bool CommandLineInterface::WriteEditionDefaults(const DescriptorPool& pool) {
  const Descriptor* feature_set;
  if (opensource_runtime_) {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  } else {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  }
  if (feature_set == nullptr) {
    std::cerr << edition_defaults_out_name_
              << ": Could not find FeatureSet in descriptor pool.  Please make "
                 "sure descriptor.proto is in your import path"
              << std::endl;
    return false;
  }
  std::vector<const FieldDescriptor*> extensions;
  pool.FindAllExtensions(feature_set, &extensions);

  Edition minimum = ProtocMinimumEdition();
  if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
    minimum = edition_defaults_minimum_;
  }
  Edition maximum = ProtocMaximumEdition();
  if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
    maximum = edition_defaults_maximum_;
  }

  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(feature_set, extensions, minimum,
                                       maximum);
  if (!defaults.ok()) {
    std::cerr << edition_defaults_out_name_ << ": "
              << defaults.status().message() << std::endl;
    return false;
  }

  int fd;
  do {
    fd = open(edition_defaults_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(edition_defaults_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!defaults->SerializeToCodedStream(&coded_out)) {
      std::cerr << edition_defaults_out_name_ << ": "
                << strerror(out.GetErrno()) << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << edition_defaults_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}